

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolIPv4.cpp
# Opt level: O0

void __thiscall ProtocolIPv4::Retry(ProtocolIPv4 *this)

{
  int iVar1;
  long *item;
  uint8_t *puVar2;
  int local_2c;
  int i;
  uint8_t *targetMAC;
  DataBuffer *buffer;
  int count;
  ProtocolIPv4 *this_local;
  
  iVar1 = osQueue::GetCount(&this->UnresolvedQueue);
  for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
    item = (long *)osQueue::Get(&this->UnresolvedQueue);
    puVar2 = ProtocolARP::Protocol2Hardware(this->ARP,(uint8_t *)(*item + 0x10));
    if (puVar2 == (uint8_t *)0x0) {
      printf("Still could not find MAC for IP\n");
      osQueue::Put(&this->UnresolvedQueue,item);
    }
    else {
      (*this->MAC->_vptr_InterfaceMAC[10])(this->MAC,item,puVar2,0x800);
    }
  }
  return;
}

Assistant:

void ProtocolIPv4::Retry()
{
    int count;
    DataBuffer* buffer;
    const uint8_t* targetMAC;

    count = UnresolvedQueue.GetCount();
    for (int i = 0; i < count; i++)
    {
        buffer = (DataBuffer*)UnresolvedQueue.Get();

        targetMAC = ARP.Protocol2Hardware(&buffer->Packet[16]);
        if (targetMAC != nullptr)
        {
            MAC.Transmit(buffer, targetMAC, 0x0800);
        }
        else
        {
            printf("Still could not find MAC for IP\n");
            UnresolvedQueue.Put(buffer);
        }
    }
}